

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_Asn1.cpp
# Opt level: O1

String * axl::cry::getAsn1TimeString(String *__return_storage_ptr__,ASN1_TIME *time)

{
  BIO_METHOD *method;
  BUF_MEM *pBVar1;
  Bio bio;
  Handle<bio_st_*,_axl::cry::FreeBio,_axl::sl::Zero<bio_st_*>_> local_18;
  
  local_18.m_h = (bio_st *)0x0;
  method = BIO_s_mem();
  Bio::create((Bio *)&local_18,(BIO_METHOD *)method);
  ASN1_TIME_print((BIO *)local_18.m_h,(ASN1_TIME *)time);
  pBVar1 = Bio::getBufMem((Bio *)&local_18);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            (__return_storage_ptr__,pBVar1->data,pBVar1->length);
  sl::Handle<bio_st_*,_axl::cry::FreeBio,_axl::sl::Zero<bio_st_*>_>::~Handle(&local_18);
  return __return_storage_ptr__;
}

Assistant:

sl::String
getAsn1TimeString(const ASN1_TIME* time) {
	Bio bio;
	bio.createMem();
	ASN1_TIME_print(bio, time);

	BUF_MEM* mem = bio.getBufMem();
	return sl::String(mem->data, mem->length);
}